

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_environment.cpp
# Opt level: O2

void just_test_test_case_f_test_variable_existence(void)

{
  bool bVar1;
  allocator<char> local_51;
  assert_msg local_50;
  string local_28 [32];
  
  std::__cxx11::string::string<std::allocator<char>>
            (local_28,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/environment/test/test_environment.cpp"
             ,&local_51);
  std::__cxx11::string::string((string *)&local_50,local_28);
  local_50._line = 0x59;
  bVar1 = just::environment::exists((string *)(anonymous_namespace)::var_abi_cxx11_);
  just::test::assert_msg::operator()(&local_50,!bVar1);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string(local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"yes I have",(allocator<char> *)local_28);
  just::environment::set((string *)(anonymous_namespace)::var_abi_cxx11_,&local_50._filename);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>
            (local_28,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/environment/test/test_environment.cpp"
             ,&local_51);
  std::__cxx11::string::string((string *)&local_50,local_28);
  local_50._line = 0x5b;
  bVar1 = just::environment::exists((string *)(anonymous_namespace)::var_abi_cxx11_);
  just::test::assert_msg::operator()(&local_50,bVar1);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string(local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"",(allocator<char> *)local_28);
  just::environment::set((string *)(anonymous_namespace)::var_abi_cxx11_,&local_50._filename);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>
            (local_28,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/environment/test/test_environment.cpp"
             ,&local_51);
  std::__cxx11::string::string((string *)&local_50,local_28);
  local_50._line = 0x5d;
  bVar1 = just::environment::exists((string *)(anonymous_namespace)::var_abi_cxx11_);
  just::test::assert_msg::operator()(&local_50,bVar1);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string(local_28);
  just::environment::remove((anonymous_namespace)::var_abi_cxx11_);
  std::__cxx11::string::string<std::allocator<char>>
            (local_28,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/environment/test/test_environment.cpp"
             ,&local_51);
  std::__cxx11::string::string((string *)&local_50,local_28);
  local_50._line = 0x5f;
  bVar1 = just::environment::exists((string *)(anonymous_namespace)::var_abi_cxx11_);
  just::test::assert_msg::operator()(&local_50,!bVar1);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

JUST_TEST_CASE(test_variable_existence)
{
  JUST_ASSERT(!environment::exists(var));
  environment::set(var, "yes I have");
  JUST_ASSERT(environment::exists(var));
  environment::set(var, "");
  JUST_ASSERT(environment::exists(var));
  environment::remove(var);
  JUST_ASSERT(!environment::exists(var));
}